

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_elements_address.cpp
# Opt level: O2

void __thiscall
ElementsAddressFactory_Constructor_type_prefix_Test::TestBody
          (ElementsAddressFactory_Constructor_type_prefix_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_668;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_660;
  AssertionResult gtest_ar;
  ElementsAddressFactory factory_5;
  Pubkey pubkey;
  ElementsAddressFactory factory;
  Address local_488;
  Address local_308;
  Address local_188;
  
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::GetBitcoinAddressFormatList();
      cfd::ElementsAddressFactory::ElementsAddressFactory
                (&factory,kMainnet,
                 (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                  *)&factory_5);
      std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
      ~vector((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *
              )&factory_5);
      cfd::AddressFactory::~AddressFactory(&factory.super_AddressFactory);
    }
  }
  else {
    testing::Message::Message((Message *)&factory);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&factory_5,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_elements_address.cpp"
               ,0x2b,
               "Expected: ElementsAddressFactory factory(NetType::kMainnet, GetBitcoinAddressFormatList()) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&factory_5,(Message *)&factory);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&factory_5);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&factory);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::GetBitcoinAddressFormatList();
      cfd::ElementsAddressFactory::ElementsAddressFactory
                (&factory,kTestnet,
                 (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                  *)&factory_5);
      std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
      ~vector((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *
              )&factory_5);
      cfd::AddressFactory::~AddressFactory(&factory.super_AddressFactory);
    }
  }
  else {
    testing::Message::Message((Message *)&factory);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&factory_5,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_elements_address.cpp"
               ,0x2c,
               "Expected: ElementsAddressFactory factory(NetType::kTestnet, GetBitcoinAddressFormatList()) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&factory_5,(Message *)&factory);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&factory_5);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&factory);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::GetBitcoinAddressFormatList();
      cfd::ElementsAddressFactory::ElementsAddressFactory
                (&factory,kRegtest,
                 (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                  *)&factory_5);
      std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
      ~vector((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *
              )&factory_5);
      cfd::AddressFactory::~AddressFactory(&factory.super_AddressFactory);
    }
  }
  else {
    testing::Message::Message((Message *)&factory);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&factory_5,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_elements_address.cpp"
               ,0x2d,
               "Expected: ElementsAddressFactory factory(NetType::kRegtest, GetBitcoinAddressFormatList()) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&factory_5,(Message *)&factory);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&factory_5);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&factory);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::GetElementsAddressFormatList();
      cfd::ElementsAddressFactory::ElementsAddressFactory
                (&factory,kLiquidV1,
                 (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                  *)&factory_5);
      std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
      ~vector((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *
              )&factory_5);
      cfd::AddressFactory::~AddressFactory(&factory.super_AddressFactory);
    }
  }
  else {
    testing::Message::Message((Message *)&factory);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&factory_5,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_elements_address.cpp"
               ,0x2e,
               "Expected: ElementsAddressFactory factory(NetType::kLiquidV1, GetElementsAddressFormatList()) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&factory_5,(Message *)&factory);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&factory_5);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&factory);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::GetElementsAddressFormatList();
      cfd::ElementsAddressFactory::ElementsAddressFactory
                (&factory,kElementsRegtest,
                 (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                  *)&factory_5);
      std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
      ~vector((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *
              )&factory_5);
      cfd::AddressFactory::~AddressFactory(&factory.super_AddressFactory);
    }
  }
  else {
    testing::Message::Message((Message *)&factory);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&factory_5,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_elements_address.cpp"
               ,0x2f,
               "Expected: ElementsAddressFactory factory(NetType::kElementsRegtest, GetElementsAddressFormatList()) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&factory_5,(Message *)&factory);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&factory_5);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&factory);
  }
  std::__cxx11::string::string
            ((string *)&factory,"027592aab5d43618dda13fba71e3993cd7517a712d3da49664c06ee1bd3d1f70af"
             ,(allocator *)&factory_5);
  cfd::core::Pubkey::Pubkey(&pubkey,(string *)&factory);
  std::__cxx11::string::~string((string *)&factory);
  cfd::core::GetElementsAddressFormatList();
  cfd::ElementsAddressFactory::ElementsAddressFactory
            (&factory_5,kLiquidV1,
             (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             &factory);
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            ((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             &factory);
  cfd::AddressFactory::CreateP2wpkhAddress
            ((Address *)&factory,&factory_5.super_AddressFactory,&pubkey);
  local_660.ptr_._0_4_ = factory.super_AddressFactory._vptr_AddressFactory._0_4_;
  local_668.data_._0_4_ = 3;
  testing::internal::CmpHelperEQ<cfd::core::NetType,cfd::core::NetType>
            ((internal *)&gtest_ar,"address.GetNetType()","NetType::kLiquidV1",(NetType *)&local_660
             ,(NetType *)&local_668);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_660);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_668,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_elements_address.cpp"
               ,0x35,pcVar2);
    testing::internal::AssertHelper::operator=(&local_668,(Message *)&local_660);
    testing::internal::AssertHelper::~AssertHelper(&local_668);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_660);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_660.ptr_._0_4_ = factory.super_AddressFactory.type_;
  local_668.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<cfd::core::WitnessVersion,cfd::core::WitnessVersion>
            ((internal *)&gtest_ar,"address.GetWitnessVersion()","WitnessVersion::kVersion0",
             (WitnessVersion *)&local_660,(WitnessVersion *)&local_668);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_660);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_668,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_elements_address.cpp"
               ,0x36,pcVar2);
    testing::internal::AssertHelper::operator=(&local_668,(Message *)&local_660);
    testing::internal::AssertHelper::~AssertHelper(&local_668);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_660);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::Address::~Address((Address *)&factory);
  cfd::AddressFactory::~AddressFactory(&factory_5.super_AddressFactory);
  cfd::core::GetElementsAddressFormatList();
  cfd::ElementsAddressFactory::ElementsAddressFactory
            (&factory_5,kElementsRegtest,
             (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             &factory);
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            ((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             &factory);
  cfd::AddressFactory::CreateP2pkhAddress
            ((Address *)&factory,&factory_5.super_AddressFactory,&pubkey);
  local_660.ptr_._0_4_ = factory.super_AddressFactory._vptr_AddressFactory._0_4_;
  local_668.data_._0_4_ = 4;
  testing::internal::CmpHelperEQ<cfd::core::NetType,cfd::core::NetType>
            ((internal *)&gtest_ar,"address.GetNetType()","NetType::kElementsRegtest",
             (NetType *)&local_660,(NetType *)&local_668);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_660);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_668,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_elements_address.cpp"
               ,0x3b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_668,(Message *)&local_660);
    testing::internal::AssertHelper::~AssertHelper(&local_668);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_660);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_660.ptr_._0_4_ = factory.super_AddressFactory.type_;
  local_668.data_._0_4_ = 0xffffffff;
  testing::internal::CmpHelperEQ<cfd::core::WitnessVersion,cfd::core::WitnessVersion>
            ((internal *)&gtest_ar,"address.GetWitnessVersion()","WitnessVersion::kVersionNone",
             (WitnessVersion *)&local_660,(WitnessVersion *)&local_668);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_660);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_668,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_elements_address.cpp"
               ,0x3c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_668,(Message *)&local_660);
    testing::internal::AssertHelper::~AssertHelper(&local_668);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_660);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::Address::~Address((Address *)&factory);
  cfd::AddressFactory::~AddressFactory(&factory_5.super_AddressFactory);
  cfd::core::GetElementsAddressFormatList();
  cfd::ElementsAddressFactory::ElementsAddressFactory
            (&factory,kMainnet,
             (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             &factory_5);
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            ((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             &factory_5);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    cfd::AddressFactory::CreateP2pkhAddress(&local_188,&factory.super_AddressFactory,&pubkey);
    cfd::core::Address::~Address(&local_188);
  }
  testing::Message::Message((Message *)&factory_5);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&gtest_ar,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_elements_address.cpp"
             ,0x42,
             "Expected: (factory.CreateP2pkhAddress(pubkey)) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&factory_5);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&factory_5);
  cfd::AddressFactory::~AddressFactory(&factory.super_AddressFactory);
  cfd::core::GetElementsAddressFormatList();
  cfd::ElementsAddressFactory::ElementsAddressFactory
            (&factory,kTestnet,
             (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             &factory_5);
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            ((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             &factory_5);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    cfd::AddressFactory::CreateP2pkhAddress(&local_308,&factory.super_AddressFactory,&pubkey);
    cfd::core::Address::~Address(&local_308);
  }
  testing::Message::Message((Message *)&factory_5);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&gtest_ar,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_elements_address.cpp"
             ,0x46,
             "Expected: (factory.CreateP2pkhAddress(pubkey)) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&factory_5);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&factory_5);
  cfd::AddressFactory::~AddressFactory(&factory.super_AddressFactory);
  cfd::core::GetElementsAddressFormatList();
  cfd::ElementsAddressFactory::ElementsAddressFactory
            (&factory,kRegtest,
             (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             &factory_5);
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            ((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             &factory_5);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    cfd::AddressFactory::CreateP2pkhAddress(&local_488,&factory.super_AddressFactory,&pubkey);
    cfd::core::Address::~Address(&local_488);
  }
  testing::Message::Message((Message *)&factory_5);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&gtest_ar,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_elements_address.cpp"
             ,0x4a,
             "Expected: (factory.CreateP2pkhAddress(pubkey)) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&factory_5);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&factory_5);
  cfd::AddressFactory::~AddressFactory(&factory.super_AddressFactory);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&pubkey);
  return;
}

Assistant:

TEST(ElementsAddressFactory, Constructor_type_prefix)
{
  EXPECT_NO_THROW(ElementsAddressFactory factory(NetType::kMainnet, GetBitcoinAddressFormatList()));
  EXPECT_NO_THROW(ElementsAddressFactory factory(NetType::kTestnet, GetBitcoinAddressFormatList()));
  EXPECT_NO_THROW(ElementsAddressFactory factory(NetType::kRegtest, GetBitcoinAddressFormatList()));
  EXPECT_NO_THROW(ElementsAddressFactory factory(NetType::kLiquidV1, GetElementsAddressFormatList()));
  EXPECT_NO_THROW(ElementsAddressFactory factory(NetType::kElementsRegtest, GetElementsAddressFormatList()));

  Pubkey pubkey = Pubkey("027592aab5d43618dda13fba71e3993cd7517a712d3da49664c06ee1bd3d1f70af");
  {
    ElementsAddressFactory factory(NetType::kLiquidV1, GetElementsAddressFormatList());
    Address address = factory.CreateP2wpkhAddress(pubkey);
    EXPECT_EQ(address.GetNetType(), NetType::kLiquidV1);
    EXPECT_EQ(address.GetWitnessVersion(), WitnessVersion::kVersion0);
  }
  {
    ElementsAddressFactory factory(NetType::kElementsRegtest, GetElementsAddressFormatList());
    Address address = factory.CreateP2pkhAddress(pubkey);
    EXPECT_EQ(address.GetNetType(), NetType::kElementsRegtest);
    EXPECT_EQ(address.GetWitnessVersion(), WitnessVersion::kVersionNone);
  }

  // error
  {
    ElementsAddressFactory factory(NetType::kMainnet, GetElementsAddressFormatList());
    EXPECT_THROW((factory.CreateP2pkhAddress(pubkey)), CfdException);
  }
  {
    ElementsAddressFactory factory(NetType::kTestnet, GetElementsAddressFormatList());
    EXPECT_THROW((factory.CreateP2pkhAddress(pubkey)), CfdException);
  }
  {
    ElementsAddressFactory factory(NetType::kRegtest, GetElementsAddressFormatList());
    EXPECT_THROW((factory.CreateP2pkhAddress(pubkey)), CfdException);
  }
}